

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<QGradient>
          (QOpenGL2PaintEngineExPrivate *this,QGradient *gradient,bool *newTextureCreated)

{
  Data *pDVar1;
  GLuint GVar2;
  QOpenGL2GradientCache *this_00;
  QObject *context;
  long in_FS_OFFSET;
  GLuint textureId;
  GLuint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context = (QObject *)0x0;
  }
  else {
    context = (this->ctx).wp.value;
  }
  this_00 = QOpenGL2GradientCache::cacheForContext((QOpenGLContext *)context);
  local_24 = QOpenGL2GradientCache::getBuffer(this_00,gradient,1.0);
  GVar2 = bindTexture<unsigned_int>(this,&local_24,newTextureCreated);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return GVar2;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const QGradient &gradient, bool *newTextureCreated)
{
    // We apply global opacity in the fragment shaders, so we always pass 1.0
    // for opacity to the cache.
    GLuint textureId = QOpenGL2GradientCache::cacheForContext(ctx)->getBuffer(gradient, 1.0);

    // QOpenGL2GradientCache::getBuffer() may bind and generate a new texture if it
    // hasn't been cached yet, but will otherwise return an unbound texture id. To
    // be sure that the texture is bound, we unfortunately have to bind again,
    // which results in the initial generation of the texture doing two binds.
    return bindTexture(textureId, newTextureCreated);
}